

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

void sx_hashtbl_init(sx_hashtbl *tbl,int capacity,uint32_t *keys_ptr,int *values_ptr)

{
  bool bVar1;
  code *pcVar2;
  int iVar3;
  uint uVar4;
  
  if ((capacity & capacity - 1U) == 0) {
    memset(keys_ptr,0,(long)capacity << 2);
    memset(values_ptr,0,(long)capacity << 2);
    tbl->keys = keys_ptr;
    tbl->values = values_ptr;
    iVar3 = 0x40;
    uVar4 = capacity;
    if (1 < (uint)capacity) {
      do {
        iVar3 = iVar3 + -1;
        bVar1 = 3 < uVar4;
        uVar4 = uVar4 >> 1;
      } while (bVar1);
    }
    tbl->_bitshift = iVar3;
    tbl->capacity = capacity;
    tbl->count = 0;
    tbl->_miss_cnt = 0;
    tbl->_probe_cnt = 0;
    return;
  }
  sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/hash.c",0xfe,
                    "Table size must be power of 2, get it from sx_hashtbl_valid_capacity");
  pcVar2 = (code *)swi(3);
  (*pcVar2)();
  return;
}

Assistant:

void sx_hashtbl_init(sx_hashtbl* tbl, int capacity, uint32_t* keys_ptr, int* values_ptr)
{
    sx_assertf(sx__ispow2(capacity),
              "Table size must be power of 2, get it from sx_hashtbl_valid_capacity");

    sx_memset(keys_ptr, 0x0, capacity * sizeof(uint32_t));
    sx_memset(values_ptr, 0x0, capacity * sizeof(int));

    tbl->keys = keys_ptr;
    tbl->values = values_ptr;
    tbl->_bitshift = sx__calc_bitshift(capacity);
    tbl->capacity = capacity;
    tbl->count = 0;
#if SX_CONFIG_HASHTBL_DEBUG
    tbl->_miss_cnt = 0;
    tbl->_probe_cnt = 0;
#endif
}